

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O1

void ddb_h1(long ndims,Integer *ardims,long npes,double threshold,Integer *blk,Integer *pedims)

{
  undefined8 uVar1;
  long lVar2;
  undefined8 uVar3;
  Integer *ardims_00;
  long lVar4;
  double *qedims;
  long lVar5;
  long *pdivs;
  void *__dest;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  size_t __nmemb;
  bool bVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ulong uVar26;
  undefined1 auVar27 [16];
  
  if (ndims == 1) {
    *pedims = npes;
    lVar4 = 1;
    if (1 < *ardims / npes) {
      lVar4 = *ardims / npes;
    }
    *blk = lVar4;
  }
  else {
    ardims_00 = (Integer *)calloc(ndims,8);
    if (ardims_00 == (Integer *)0x0) {
      ddb_h1_cold_4();
    }
    else {
      if (0 < ndims) {
        lVar4 = 0;
        do {
          if (blk[lVar4] < 1) {
            blk[lVar4] = 1;
          }
          lVar4 = lVar4 + 1;
        } while (ndims != lVar4);
      }
      if (0 < ndims) {
        lVar4 = 0;
        do {
          ardims_00[lVar4] = ardims[lVar4] / blk[lVar4];
          lVar4 = lVar4 + 1;
        } while (ndims != lVar4);
      }
      if (0 < ndims) {
        lVar4 = 0;
        do {
          if (ardims_00[lVar4] < 1) {
            ardims_00[lVar4] = 1;
            blk[lVar4] = ardims[lVar4];
          }
          lVar4 = lVar4 + 1;
        } while (ndims != lVar4);
      }
      qedims = (double *)calloc(ndims,8);
      if (qedims == (double *)0x0) {
        ddb_h1_cold_3();
      }
      else {
        *qedims = (double)npes;
        if (1 < ndims) {
          dVar11 = *qedims;
          lVar4 = 1;
          do {
            dVar11 = dVar11 / ((double)ardims_00[lVar4] / (double)*ardims_00);
            lVar4 = lVar4 + 1;
          } while (ndims != lVar4);
          *qedims = dVar11;
        }
        dVar11 = pow(*qedims,1.0 / (double)ndims);
        *qedims = dVar11;
        if (1 < ndims) {
          lVar4 = *ardims_00;
          lVar5 = 1;
          do {
            qedims[lVar5] = ((double)ardims_00[lVar5] / (double)lVar4) * *qedims;
            lVar5 = lVar5 + 1;
          } while (ndims != lVar5);
        }
        __nmemb = 1;
        if (1 < npes) {
          lVar4 = npes + -2;
          auVar13._8_4_ = (int)lVar4;
          auVar13._0_8_ = lVar4;
          auVar13._12_4_ = (int)((ulong)lVar4 >> 0x20);
          auVar23 = ZEXT416(1);
          uVar8 = 0;
          auVar13 = auVar13 ^ _DAT_001b3f40;
          do {
            auVar16._8_4_ = (int)uVar8;
            auVar16._0_8_ = uVar8;
            auVar16._12_4_ = (int)(uVar8 >> 0x20);
            auVar17 = (auVar16 | _DAT_001b3f60) ^ _DAT_001b3f40;
            auVar21._0_4_ = -(uint)(auVar13._0_4_ < auVar17._0_4_);
            auVar21._4_4_ = -(uint)(auVar13._4_4_ < auVar17._4_4_);
            auVar21._8_4_ = -(uint)(auVar13._8_4_ < auVar17._8_4_);
            auVar21._12_4_ = -(uint)(auVar13._12_4_ < auVar17._12_4_);
            auVar18._4_4_ = -(uint)(auVar17._4_4_ == auVar13._4_4_);
            auVar18._12_4_ = -(uint)(auVar17._12_4_ == auVar13._12_4_);
            auVar18._0_4_ = auVar18._4_4_;
            auVar18._8_4_ = auVar18._12_4_;
            auVar17._4_4_ = auVar21._4_4_;
            auVar17._0_4_ = auVar21._4_4_;
            auVar17._8_4_ = auVar21._12_4_;
            auVar17._12_4_ = auVar21._12_4_;
            auVar17 = auVar18 & auVar21 | auVar17;
            auVar24 = auVar23;
            if ((~auVar17._0_4_ & 1) != 0) {
              auVar24._8_8_ = 0;
              auVar24._0_8_ = (ulong)npes % (uVar8 + 2);
            }
            if (((auVar17._8_2_ ^ 0xffff) & 1) != 0) {
              auVar24._8_8_ = (ulong)npes % (uVar8 + 3);
            }
            auVar25._0_4_ = -(uint)(auVar24._0_4_ == 0);
            auVar25._4_4_ = -(uint)(auVar24._4_4_ == 0);
            auVar25._8_4_ = -(uint)(auVar24._8_4_ == 0);
            auVar25._12_4_ = -(uint)(auVar24._12_4_ == 0);
            auVar27._4_4_ = auVar25._0_4_;
            auVar27._0_4_ = auVar25._4_4_;
            auVar27._8_4_ = auVar25._12_4_;
            auVar27._12_4_ = auVar25._8_4_;
            uVar22 = auVar23._0_8_;
            uVar26 = auVar23._8_8_;
            auVar23._0_8_ = uVar22 - SUB168(auVar27 & auVar25,0);
            auVar23._8_8_ = uVar26 - SUB168(auVar27 & auVar25,8);
            uVar8 = uVar8 + 2;
          } while ((npes & 0x7ffffffffffffffeU) != uVar8);
          auVar14._4_4_ = auVar21._0_4_;
          auVar14._0_4_ = auVar21._0_4_;
          auVar14._8_4_ = auVar21._8_4_;
          auVar14._12_4_ = auVar21._8_4_;
          auVar19._4_4_ = auVar21._4_4_;
          auVar19._0_4_ = auVar21._4_4_;
          auVar19._8_4_ = auVar21._12_4_;
          auVar19._12_4_ = auVar21._12_4_;
          auVar19 = auVar18 & auVar14 | auVar19;
          auVar20._0_8_ = uVar22 & auVar19._0_8_;
          auVar20._8_8_ = uVar26 & auVar19._8_8_;
          auVar20 = ~auVar19 & auVar23 | auVar20;
          __nmemb = auVar20._8_8_ + auVar20._0_8_;
        }
        pdivs = (long *)calloc(__nmemb,8);
        if (pdivs == (long *)0x0) {
          ddb_h1_cold_2();
        }
        else {
          if (0 < npes) {
            lVar4 = 0;
            uVar8 = 1;
            do {
              if ((ulong)npes % uVar8 == 0) {
                pdivs[lVar4] = uVar8;
                lVar4 = lVar4 + 1;
              }
              bVar10 = uVar8 != npes;
              uVar8 = uVar8 + 1;
            } while (bVar10);
          }
          ddb_ap(ndims,qedims,ardims_00,pedims,npes,__nmemb,pdivs);
          free(qedims);
          free(pdivs);
          __dest = calloc(ndims,8);
          if (__dest == (void *)0x0) {
            ddb_h1_cold_1();
          }
          else {
            dVar11 = 1.0;
            if (0 < ndims) {
              dVar11 = 1.0;
              lVar4 = 0;
              do {
                lVar5 = ardims_00[lVar4];
                dVar11 = dVar11 * ((double)(lVar5 - lVar5 % pedims[lVar4]) / (double)lVar5);
                lVar4 = lVar4 + 1;
              } while (ndims != lVar4);
            }
            if (0 < ndims) {
              memcpy(__dest,pedims,ndims * 8);
            }
            lVar4 = *ardims_00;
            do {
              if (0 < ndims) {
                memcpy(pedims,__dest,ndims * 8);
              }
              lVar5 = *pedims;
              lVar7 = lVar5;
              if (lVar5 <= lVar4) {
                lVar7 = lVar4 % lVar5;
              }
              if (ndims < 2) {
                lVar9 = 0;
              }
              else {
                lVar6 = 1;
                lVar9 = 0;
                dVar12 = (double)lVar7 / (double)lVar5;
                do {
                  lVar5 = pedims[lVar6];
                  lVar7 = lVar5;
                  if (lVar5 <= ardims_00[lVar6]) {
                    lVar7 = ardims_00[lVar6] % lVar5;
                  }
                  dVar15 = (double)lVar7 / (double)lVar5;
                  lVar5 = lVar6;
                  if (dVar15 <= dVar12) {
                    dVar15 = dVar12;
                    lVar5 = lVar9;
                  }
                  lVar9 = lVar5;
                  lVar6 = lVar6 + 1;
                  dVar12 = dVar15;
                } while (ndims != lVar6);
              }
              lVar5 = lVar9;
              dVar12 = dVar11;
              if (0 < ndims) {
                lVar7 = 0;
                dVar15 = dVar11;
                do {
                  dVar12 = dVar15;
                  if (lVar7 != lVar9) {
                    uVar1 = *(undefined8 *)((long)__dest + lVar9 * 8);
                    *(undefined8 *)((long)__dest + lVar9 * 8) =
                         *(undefined8 *)((long)__dest + lVar7 * 8);
                    *(undefined8 *)((long)__dest + lVar7 * 8) = uVar1;
                    dVar12 = 1.0;
                    if (0 < ndims) {
                      lVar6 = 0;
                      dVar12 = 1.0;
                      do {
                        lVar2 = ardims_00[lVar6];
                        dVar12 = dVar12 * ((double)(lVar2 - lVar2 % *(long *)((long)__dest +
                                                                             lVar6 * 8)) /
                                          (double)lVar2);
                        lVar6 = lVar6 + 1;
                      } while (ndims != lVar6);
                    }
                    lVar6 = lVar7;
                    if (dVar12 <= dVar15) {
                      dVar12 = dVar15;
                      lVar6 = lVar5;
                    }
                    lVar5 = lVar6;
                    uVar3 = *(undefined8 *)((long)__dest + lVar9 * 8);
                    *(undefined8 *)((long)__dest + lVar9 * 8) = uVar1;
                    *(undefined8 *)((long)__dest + lVar7 * 8) = uVar3;
                  }
                  lVar7 = lVar7 + 1;
                  dVar15 = dVar12;
                } while (lVar7 != ndims);
              }
              if (lVar5 != lVar9) {
                uVar1 = *(undefined8 *)((long)__dest + lVar9 * 8);
                *(undefined8 *)((long)__dest + lVar9 * 8) =
                     *(undefined8 *)((long)__dest + lVar5 * 8);
                *(undefined8 *)((long)__dest + lVar5 * 8) = uVar1;
              }
              bVar10 = dVar11 < dVar12;
              dVar11 = dVar12;
            } while (bVar10);
            if (0 < ndims) {
              memcpy(pedims,__dest,ndims * 8);
            }
            free(__dest);
            if (dVar12 < threshold) {
              ddb_ex(ndims,ardims_00,npes,threshold,blk,pedims);
            }
            free(ardims_00);
            if (0 < ndims) {
              lVar4 = 0;
              do {
                lVar5 = ardims[lVar4] / pedims[lVar4];
                if (lVar5 < 2) {
                  lVar5 = 1;
                }
                blk[lVar4] = lVar5;
                lVar4 = lVar4 + 1;
              } while (ndims != lVar4);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ddb_h1(long ndims, Integer ardims[], long npes, double threshold,
           Integer blk[], Integer pedims[])
      {
      long h, i, j, k;
      double * qedims;
      long * pdivs;
      Integer * apdims;
	  Integer *tard;
      long npdivs;
      double t, q;
      double cb, ub, blb;
      if(ndims==1) {
         pedims[0] = npes;
         blb = dd_ev(ndims,ardims,pedims);
         dd_su(ndims,ardims,pedims,blk);
         return;
      }

      /*- Allocate memory to store the granularity -*/
      tard = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tard==NULL){
         fprintf(stderr,"%s: %s\n","ddb_h1",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }
      /*- Reset array dimensions to reflect granularity -*/
      for(i=0;i<ndims;i++) if (blk[i]<1) blk[i] = 1;
      for(i=0;i<ndims;i++) tard[i] = ardims[i] / blk[i];
      for(i=0;i<ndims;i++) if (tard[i]<1) {
         tard[i] = 1; blk[i] = ardims[i];}

      /*- First solve the load balancing problem exactly in
       *- floating point arithmetic -*/
      qedims = (double *) calloc((size_t)ndims,sizeof(double));
      if(qedims==NULL){
         fprintf(stderr,"%s: %s\n","ddb_h1",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }

      qedims[0] = (double) npes;
      for(i=1;i<ndims;i++) qedims[0] /= (tard[i]/(double)tard[0]);
      qedims[0] = pow(qedims[0],1.0/ndims);

      for(i=1;i<ndims;i++){
          qedims[i] = (tard[i]/(double)tard[0])*qedims[0];
      };

      /*- Set up the search for a integer approximation the floating point solution -*/
      npdivs = 1;
      for(i=2;i<=npes;i++) if(npes%i==0) npdivs += 1;
      pdivs = (long *) calloc((size_t)npdivs,sizeof(long));
      if(pdivs==NULL){
         fprintf(stderr,"%s: %s\n","split",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         free(qedims);
         return;
      }
      /*- Compute the discrete approximation -*/
      for(j=0,i=1;i<=npes;i++) if(npes%i==0) pdivs[j++] = i;
      ddb_ap(ndims,qedims,tard,pedims,npes,npdivs,pdivs) ; 
      free(qedims);
      free(pdivs);


      /*- Lookout for a permutation of the solution vector
       *- that would improve the initial solution -*/
      apdims = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(apdims==NULL){
         fprintf(stderr,"%s: %s\n","split",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }

      ub = dd_ev(ndims,tard,pedims);
      for(k=0;k<ndims;k++) apdims[k] = pedims[k];

      do {
         for(k=0;k<ndims;k++) pedims[k] = apdims[k];
         blb = ub;

         /*- Find the worst distributed dimension -*/
         h = 0;
         q = (tard[0]<pedims[0]) ? pedims[0] : tard[0]%pedims[0];
         q /= (double)pedims[0];
         for(k=1;k<ndims;k++){
            t = (tard[k]<pedims[k]) ? pedims[k] : tard[k]%pedims[k];
            t /= (double) pedims[k];
            if(t>q) {
              h = k; q = t;
            }
         }

         /*- Swap elements of apdims to improve load balance */
         j = h;
         for(k=0;k<ndims;k++){
            if(k==h) continue;
            i = apdims[h]; apdims[h] = apdims[k]; apdims[k] = i;
            cb = dd_ev(ndims,tard,apdims);
            if(cb>ub) {
              j = k;
              ub = cb;
            }
            i = apdims[h]; apdims[h] = apdims[k]; apdims[k] = i;
         }
         if(j!=h){
            i = apdims[h]; apdims[h] = apdims[j]; apdims[j] = i;
         }
      } while (ub > blb);

      for(i=0;i<ndims;i++) pedims[i] = apdims[i];
      blb = ub;
      free(apdims);

      /*- Do an exhaustive search is the heuristic returns a solution 
       *- whose load balance ratio is less than the given threshold. -*/
      if(blb<threshold) ddb_ex(ndims,tard,npes,threshold,blk,pedims);

      free(tard);

      dd_su(ndims,ardims,pedims,blk);

      return;
      }